

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::GenerateFastInlineGlobalObjectParseInt(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  StackSym *this_00;
  LabelInstr *target;
  LabelInstr *labelHelper_00;
  Opnd *pOVar6;
  LabelInstr *labelHelper;
  LabelInstr *doneLabel;
  Opnd *local_40;
  Opnd *parseIntArgOpnd;
  Instr *argInstr;
  IntConstType argCount;
  Instr *tmpInstr;
  Opnd *linkOpnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  linkOpnd = (Opnd *)instr;
  instr_local = (Instr *)this;
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4e50,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  tmpInstr = (Instr *)IR::Instr::GetSrc2((Instr *)linkOpnd);
  argCount = (IntConstType)Inline::GetDefInstr((Opnd *)tmpInstr);
  tmpInstr = (Instr *)IR::Instr::GetSrc2((Instr *)argCount);
  pSVar5 = IR::Opnd::AsSymOpnd((Opnd *)tmpInstr);
  this_00 = Sym::AsStackSym(pSVar5->m_sym);
  AVar3 = StackSym::GetArgSlotNum(this_00);
  argInstr = (Instr *)(ulong)AVar3;
  if (argInstr != (Instr *)0x2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4e5f,"(argCount == 2)","argCount == 2");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  parseIntArgOpnd = (Opnd *)Inline::GetDefInstr((Opnd *)tmpInstr);
  if (((Instr *)parseIntArgOpnd)->m_opcode != ArgOut_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4e63,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                       "argInstr->m_opcode == Js::OpCode::ArgOut_A");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_40 = IR::Instr::GetSrc1((Instr *)parseIntArgOpnd);
  doneLabel._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(local_40);
  bVar2 = ValueType::IsLikelyNumber((ValueType *)((long)&doneLabel + 6));
  if (bVar2) {
    target = IR::LabelInstr::New(Label,this->m_func,false);
    labelHelper_00 = IR::LabelInstr::New(Label,this->m_func,true);
    bVar2 = IR::Opnd::IsTaggedInt(local_40);
    if (!bVar2) {
      LowererMD::GenerateSmIntTest
                (&this->m_lowererMD,local_40,(Instr *)linkOpnd,labelHelper_00,(Instr **)0x0,false);
    }
    pOVar6 = IR::Instr::GetDst((Instr *)linkOpnd);
    if (pOVar6 != (Opnd *)0x0) {
      pOVar6 = IR::Instr::GetDst((Instr *)linkOpnd);
      InsertMove(pOVar6,local_40,(Instr *)linkOpnd,true);
    }
    InsertBranch(Br,target,(Instr *)linkOpnd);
    IR::Instr::InsertBefore((Instr *)linkOpnd,&labelHelper_00->super_Instr);
    IR::Instr::InsertAfter((Instr *)linkOpnd,&target->super_Instr);
    RelocateCallDirectToHelperPath(this,(Instr *)argCount,labelHelper_00);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateFastInlineGlobalObjectParseInt(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

//  ArgOut sequence
//  s8.var          =  StartCall      2 (0x2).i32                             #000c
//  arg1(s9)<0>.var =  ArgOut_A       s2.var, s8.var                          #0014 //Implicit this, global object
//  arg2(s10)<4>.var = ArgOut_A       s3.var, arg1(s9)<0>.var                 #0018 //First argument to parseInt
//  arg1(s11)<0>.u32 = ArgOut_A_InlineSpecialized  0x012C26C0 (DynamicObject).var, arg2(s10)<4>.var #
//  s0[LikelyTaggedInt].var = CallDirect  GlobalObject_ParseInt.u32, arg1(s11)<0>.u32 #001c

    IR::Opnd * linkOpnd = instr->GetSrc2();
    IR::Instr * tmpInstr = Inline::GetDefInstr(linkOpnd);// linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;
    linkOpnd = tmpInstr->GetSrc2();

#if DBG
    IntConstType argCount = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();
    Assert(argCount == 2);
#endif

    IR::Instr *argInstr = Inline::GetDefInstr(linkOpnd);
    Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A);
    IR::Opnd *parseIntArgOpnd = argInstr->GetSrc1();

    if (parseIntArgOpnd->GetValueType().IsLikelyNumber())
    {
        //If likely int check for tagged int and set the dst
        IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

        if (!parseIntArgOpnd->IsTaggedInt())
        {
            this->m_lowererMD.GenerateSmIntTest(parseIntArgOpnd, instr, labelHelper);
        }
        if (instr->GetDst())
        {
            this->InsertMove(instr->GetDst(), parseIntArgOpnd, instr);
        }
        InsertBranch(Js::OpCode::Br, doneLabel, instr);
        instr->InsertBefore(labelHelper);
        instr->InsertAfter(doneLabel);

        RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
    }
    return true;
}